

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

int __thiscall
MEM_CPY<Fad<double>_>::copy(MEM_CPY<Fad<double>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int in_EAX;
  Vector<double> *pVVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  Fad<double> tmp3;
  Fad<double> tmp2;
  Fad<double> tmp0;
  Fad<double> tmp1;
  Fad<double> local_b8;
  Fad<double> local_98;
  Fad<double> local_78;
  MEM_CPY<Fad<double>_> *local_58;
  Fad<double> local_50;
  
  uVar2 = (uint)src;
  uVar4 = uVar2 & 3;
  if (((ulong)src & 3) != 0) {
    local_58 = this + 8;
    uVar3 = 0;
    do {
      *(undefined8 *)(this + uVar3) = *(undefined8 *)(dst + uVar3);
      pVVar1 = Vector<double>::operator=
                         ((Vector<double> *)(local_58 + uVar3),(Vector<double> *)(dst + uVar3 + 8));
      in_EAX = (int)pVVar1;
      *(undefined8 *)(this + uVar3 + 0x18) = *(undefined8 *)(dst + uVar3 + 0x18);
      uVar3 = uVar3 + 0x20;
    } while (uVar4 << 5 != uVar3);
  }
  if (3 < (int)uVar2) {
    uVar3 = (ulong)(uVar4 << 5);
    do {
      Fad<double>::Fad(&local_78);
      Fad<double>::Fad(&local_50);
      Fad<double>::Fad(&local_98);
      Fad<double>::Fad(&local_b8);
      local_78.val_ = *(double *)(dst + uVar3);
      Vector<double>::operator=(&local_78.dx_,(Vector<double> *)(dst + uVar3 + 8));
      local_78.defaultVal = *(double *)(dst + uVar3 + 0x18);
      local_50.val_ = *(double *)(dst + uVar3 + 0x20);
      Vector<double>::operator=(&local_50.dx_,(Vector<double> *)(dst + uVar3 + 0x28));
      local_50.defaultVal = *(double *)(dst + uVar3 + 0x38);
      local_98.val_ = *(double *)(dst + uVar3 + 0x40);
      Vector<double>::operator=(&local_98.dx_,(Vector<double> *)(dst + uVar3 + 0x48));
      local_98.defaultVal = *(double *)(dst + uVar3 + 0x58);
      local_b8.val_ = *(double *)(dst + uVar3 + 0x60);
      Vector<double>::operator=(&local_b8.dx_,(Vector<double> *)(dst + uVar3 + 0x68));
      local_b8.defaultVal = *(double *)(dst + uVar3 + 0x78);
      *(double *)(this + uVar3) = local_78.val_;
      Vector<double>::operator=((Vector<double> *)(this + uVar3 + 8),&local_78.dx_);
      *(double *)(this + uVar3 + 0x18) = local_78.defaultVal;
      *(double *)(this + uVar3 + 0x20) = local_50.val_;
      Vector<double>::operator=((Vector<double> *)(this + uVar3 + 0x28),&local_50.dx_);
      *(double *)(this + uVar3 + 0x38) = local_50.defaultVal;
      *(double *)(this + uVar3 + 0x40) = local_98.val_;
      Vector<double>::operator=((Vector<double> *)(this + uVar3 + 0x48),&local_98.dx_);
      *(double *)(this + uVar3 + 0x58) = local_98.defaultVal;
      *(double *)(this + uVar3 + 0x60) = local_b8.val_;
      Vector<double>::operator=((Vector<double> *)(this + uVar3 + 0x68),&local_b8.dx_);
      *(double *)(this + uVar3 + 0x78) = local_b8.defaultVal;
      Fad<double>::~Fad(&local_b8);
      Fad<double>::~Fad(&local_98);
      Fad<double>::~Fad(&local_50);
      Fad<double>::~Fad(&local_78);
      in_EAX = 0x80;
      this = this + 0x80;
      dst = dst + 0x80;
      uVar4 = uVar4 + 4;
    } while ((int)uVar4 < (int)uVar2);
  }
  return in_EAX;
}

Assistant:

static void copy(T* RESTRICT dest, const T* src, const int N)
    {
      // Unwind the inner loop, four elements at a time
      int Nmod4 = N & 0x03;

      int i=0;
      for (; i< Nmod4; ++i)
	dest[i] = src[i];

      for (; i<N; i+=4)
        {
	  // Common subexpression elimination: avoid doing i+1, i+2, i+3
	  // multiple times (compilers *won't* do this cse automatically) 
	  int i1 = i+1;
	  int i2 = i+2;
	  int i3 = i+3;

	  // Reading all the results first avoids aliasing
	  // ambiguities, and provides more flexibility in
	  // register allocation & instruction scheduling
	  T tmp0,tmp1, tmp2, tmp3;
	  tmp0 = src[i];
	  tmp1 = src[i1];
	  tmp2 = src[i2];
	  tmp3 = src[i3];

	  dest[i]  = tmp0;
	  dest[i1] = tmp1;
	  dest[i2] = tmp2;
	  dest[i3] = tmp3;
        }
    }